

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_undefined(void)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bson_t *bcon;
  
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0,"foo",uVar2,5);
  uVar3 = bson_bcone_magic();
  bVar1 = bcon_extract(uVar2,"foo",uVar3,5,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x4d,"test_undefined","BCON_EXTRACT (bcon, \"foo\", BCONE_UNDEFINED)");
    abort();
  }
  bson_destroy(uVar2);
  return;
}

Assistant:

static void
test_undefined (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_undefined (&expected, "foo", -1);

   BCON_APPEND (&bcon, "foo", BCON_UNDEFINED);

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}